

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_atomic_counters_limit
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  ostream *poVar1;
  ProgramSources *sources;
  ShaderProgram program;
  ostringstream shaderBody;
  ostringstream shaderDecl;
  string local_530;
  string local_510;
  string local_4f0;
  undefined1 local_4d0 [40];
  ProgramSources local_4a8;
  ShaderProgram local_3d8;
  ostream local_308;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_308);
  poVar1 = std::operator<<(&local_190,
                           "layout(binding = 0, offset = 0) uniform atomic_uint u_atomic0;\n");
  poVar1 = std::operator<<(poVar1,"layout(binding = 0, offset = ");
  getResourceLimit(ctx,0x8265);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,") uniform atomic_uint u_atomic1;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(binding = 0) buffer Output {\n");
  poVar1 = std::operator<<(poVar1,"    uint value;\n");
  std::operator<<(poVar1,"} sb_out;\n");
  poVar1 = std::operator<<(&local_308,"    uint oldVal = 0u;\n");
  poVar1 = std::operator<<(poVar1,"    oldVal = atomicCounterIncrement(u_atomic0);\n");
  poVar1 = std::operator<<(poVar1,"    oldVal = atomicCounterIncrement(u_atomic1);\n");
  std::operator<<(poVar1,"    sb_out.value = oldVal;\n");
  renderCtx = ctx->m_renderCtx;
  memset(&local_4a8,0,0xac);
  local_4a8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4a8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_4a8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_4a8._193_8_ = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_4f0,ctx,&local_510,&local_530);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_4d0,&local_4f0);
  sources = glu::ProgramSources::operator<<(&local_4a8,(ShaderSource *)local_4d0);
  glu::ShaderProgram::ShaderProgram(&local_3d8,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_4d0 + 8));
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  glu::ProgramSources::~ProgramSources(&local_4a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_ATOMIC_COUNTERS.",
             (allocator<char> *)local_4d0);
  NegativeTestContext::beginSection(ctx,(string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  verifyLinkError(ctx,&local_3d8);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_3d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_308);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return;
}

Assistant:

void exceed_atomic_counters_limit (NegativeTestContext& ctx)
{
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "layout(binding = 0, offset = 0) uniform atomic_uint u_atomic0;\n"
				<< "layout(binding = 0, offset = " << sizeof(GLuint) * getResourceLimit(ctx, GL_MAX_COMPUTE_ATOMIC_COUNTERS) << ") uniform atomic_uint u_atomic1;\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    uint value;\n"
				<< "} sb_out;\n";

	shaderBody	<< "    uint oldVal = 0u;\n"
				<< "    oldVal = atomicCounterIncrement(u_atomic0);\n"
				<< "    oldVal = atomicCounterIncrement(u_atomic1);\n"
				<< "    sb_out.value = oldVal;\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_ATOMIC_COUNTERS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}